

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raymath.h
# Opt level: O0

Matrix * MatrixRotateXYZ(Matrix *__return_storage_ptr__,Vector3 ang)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  Matrix *result;
  float sinx;
  float cosx;
  float siny;
  float cosy;
  float sinz;
  float cosz;
  float local_14;
  float fStack_10;
  Vector3 ang_local;
  
  MatrixIdentity();
  fVar1 = cosf(-ang.z);
  fVar2 = sinf(-ang.z);
  fStack_10 = ang.y;
  fVar3 = cosf(-fStack_10);
  fVar4 = sinf(-fStack_10);
  local_14 = ang.x;
  fVar5 = cosf(-local_14);
  fVar6 = sinf(-local_14);
  __return_storage_ptr__->m0 = fVar1 * fVar3;
  __return_storage_ptr__->m4 = fVar1 * fVar4 * fVar6 + -(fVar2 * fVar5);
  __return_storage_ptr__->m8 = fVar1 * fVar4 * fVar5 + fVar2 * fVar6;
  __return_storage_ptr__->m1 = fVar2 * fVar3;
  __return_storage_ptr__->m5 = fVar2 * fVar4 * fVar6 + fVar1 * fVar5;
  __return_storage_ptr__->m9 = fVar2 * fVar4 * fVar5 + -(fVar1 * fVar6);
  __return_storage_ptr__->m2 = -fVar4;
  __return_storage_ptr__->m6 = fVar3 * fVar6;
  __return_storage_ptr__->m10 = fVar3 * fVar5;
  return __return_storage_ptr__;
}

Assistant:

RMDEF Matrix MatrixRotateXYZ(Vector3 ang)
{
    Matrix result = MatrixIdentity();

    float cosz = cosf(-ang.z);
    float sinz = sinf(-ang.z);
    float cosy = cosf(-ang.y);
    float siny = sinf(-ang.y);
    float cosx = cosf(-ang.x);
    float sinx = sinf(-ang.x);

    result.m0 = cosz*cosy;
    result.m4 = (cosz*siny*sinx) - (sinz*cosx);
    result.m8 = (cosz*siny*cosx) + (sinz*sinx);

    result.m1 = sinz*cosy;
    result.m5 = (sinz*siny*sinx) + (cosz*cosx);
    result.m9 = (sinz*siny*cosx) - (cosz*sinx);

    result.m2 = -siny;
    result.m6 = cosy*sinx;
    result.m10= cosy*cosx;

    return result;
}